

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::VisitExport
          (NameApplier *this,Index export_index,Export *export_)

{
  Export *export__local;
  Index export_index_local;
  NameApplier *this_local;
  
  switch(export_->kind) {
  case First:
    UseNameForFuncVar(this,&export_->var);
    break;
  case Table:
    UseNameForTableVar(this,&export_->var);
    break;
  case Memory:
    UseNameForMemoryVar(this,&export_->var);
    break;
  case Global:
    UseNameForGlobalVar(this,&export_->var);
    break;
  case Last:
    UseNameForTagVar(this,&export_->var);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::VisitExport(Index export_index, Export* export_) {
  switch (export_->kind) {
    case ExternalKind::Func:
      UseNameForFuncVar(&export_->var);
      break;

    case ExternalKind::Table:
      UseNameForTableVar(&export_->var);
      break;

    case ExternalKind::Memory:
      UseNameForMemoryVar(&export_->var);
      break;

    case ExternalKind::Global:
      UseNameForGlobalVar(&export_->var);
      break;

    case ExternalKind::Tag:
      UseNameForTagVar(&export_->var);
      break;
  }
  return Result::Ok;
}